

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback<true>
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  LogMessage *pLVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  pair<const_char_*,_bool> pVar8;
  bool local_139;
  int local_138;
  bool local_131;
  LogMessage local_130;
  Voidify local_119;
  Nullable<const_char_*> local_118;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  void *local_108;
  LogMessage local_100;
  Voidify local_e9;
  Nullable<const_char_*> local_e8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  char *p;
  LogMessage local_d0;
  Voidify local_b9;
  LogMessage local_b8;
  Voidify local_a1;
  Nullable<const_char_*> local_a0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_90;
  Voidify local_79;
  int local_78;
  byte local_71;
  LogMessage local_70;
  Voidify local_5d [20];
  byte local_49;
  LogMessage local_48;
  Voidify local_32;
  bool local_31;
  void *local_30;
  int local_28;
  int local_24;
  int depth_local;
  int overrun_local;
  EpsCopyInputStream *this_local;
  bool local_10;
  
  local_28 = depth;
  local_24 = overrun;
  _depth_local = this;
  if (this->limit_ < overrun) {
    local_30 = (void *)0x0;
    local_31 = true;
    std::pair<const_char_*,_bool>::pair<std::nullptr_t,_bool,_true>
              ((pair<const_char_*,_bool> *)&this_local,&local_30,&local_31);
    uVar7 = extraout_RDX;
  }
  else {
    local_49 = 0;
    if (overrun == this->limit_) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                 ,0xad,"overrun != limit_");
      local_49 = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_32,pLVar6);
    }
    if ((local_49 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
    local_71 = 0;
    if (this->limit_ <= local_24) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                 ,0xae,"overrun < limit_");
      local_71 = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
      absl::lts_20250127::log_internal::Voidify::operator&&(local_5d,pLVar6);
    }
    if ((local_71 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_70);
    }
    pcVar5 = this->limit_end_;
    pcVar1 = this->buffer_end_;
    local_78 = 0;
    piVar4 = std::min<int>(&local_78,&this->limit_);
    absl_log_internal_check_op_result._7_1_ = 0;
    if (pcVar5 != pcVar1 + *piVar4) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb3,"limit_end_ == buffer_end_ + (std::min)(0, limit_)");
      absl_log_internal_check_op_result._7_1_ = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar6);
    }
    if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->limit_);
    iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_a0 = absl::lts_20250127::log_internal::Check_GTImpl(iVar2,iVar3,"limit_ > 0");
    if (local_a0 != (Nullable<const_char_*>)0x0) {
      pcVar5 = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb5,pcVar5);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar6);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_b8);
    }
    p._7_1_ = 0;
    if (this->limit_end_ != this->buffer_end_) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb6,"limit_end_ == buffer_end_");
      p._7_1_ = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_b9,pLVar6);
    }
    if ((p._7_1_ & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_d0);
    }
    do {
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(local_24);
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      local_e8 = absl::lts_20250127::log_internal::Check_GEImpl(iVar2,iVar3,"overrun >= 0");
      if (local_e8 != (Nullable<const_char_*>)0x0) {
        pcVar5 = absl::lts_20250127::implicit_cast<char_const*>(local_e8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                   ,0xba,pcVar5);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_100);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_e9,pLVar6);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_100);
      }
      absl_log_internal_check_op_result_1 = NextBuffer<true>(this,local_24,local_28);
      if (absl_log_internal_check_op_result_1 == (char *)0x0) {
        if (local_24 == 0) {
          iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->limit_);
          iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
          local_118 = absl::lts_20250127::log_internal::Check_GTImpl(iVar2,iVar3,"limit_ > 0");
          if (local_118 != (Nullable<const_char_*>)0x0) {
            pcVar5 = absl::lts_20250127::implicit_cast<char_const*>(local_118);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_130,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                       ,0xbf,pcVar5);
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_130);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_119,pLVar6);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_130);
          }
          this->limit_end_ = this->buffer_end_;
          SetEndOfStream(this);
          local_131 = true;
          std::pair<const_char_*,_bool>::pair<const_char_*&,_bool,_true>
                    ((pair<const_char_*,_bool> *)&this_local,&this->buffer_end_,&local_131);
          uVar7 = extraout_RDX_01;
        }
        else {
          local_108 = (void *)0x0;
          absl_log_internal_check_op_result_2._7_1_ = 1;
          std::pair<const_char_*,_bool>::pair<std::nullptr_t,_bool,_true>
                    ((pair<const_char_*,_bool> *)&this_local,&local_108,
                     (bool *)((long)&absl_log_internal_check_op_result_2 + 7));
          uVar7 = extraout_RDX_00;
        }
        goto LAB_0032cea7;
      }
      this->limit_ = this->limit_ -
                     ((int)this->buffer_end_ - (int)absl_log_internal_check_op_result_1);
      absl_log_internal_check_op_result_1 = absl_log_internal_check_op_result_1 + local_24;
      local_24 = (int)absl_log_internal_check_op_result_1 - (int)this->buffer_end_;
    } while (-1 < local_24);
    pcVar5 = this->buffer_end_;
    local_138 = 0;
    piVar4 = std::min<int>(&local_138,&this->limit_);
    this->limit_end_ = pcVar5 + *piVar4;
    local_139 = false;
    std::pair<const_char_*,_bool>::pair<const_char_*&,_bool,_true>
              ((pair<const_char_*,_bool> *)&this_local,&absl_log_internal_check_op_result_1,
               &local_139);
    uVar7 = extraout_RDX_02;
  }
LAB_0032cea7:
  pVar8._9_7_ = (undefined7)((ulong)uVar7 >> 8);
  pVar8.second = local_10;
  pVar8.first = (char *)this_local;
  return pVar8;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(int overrun,
                                                              int depth) {
  // Did we exceeded the limit (parse error).
  if (ABSL_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  ABSL_DCHECK(overrun != limit_);  // Guaranteed by caller.
  ABSL_DCHECK(overrun < limit_);   // Follows from above
  // TODO Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  ABSL_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  ABSL_DCHECK_GT(limit_, 0);
  ABSL_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  const char* p;
  do {
    // We are past the end of buffer_end_, in the slop region.
    ABSL_DCHECK_GE(overrun, 0);
    p = NextBuffer<kExperimentalV2>(overrun, depth);
    if (p == nullptr) {
      // We are at the end of the stream
      if (ABSL_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      ABSL_DCHECK_GT(limit_, 0);
      limit_end_ = buffer_end_;
      // Distinguish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {buffer_end_, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    p += overrun;
    overrun = p - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {p, false};
}